

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

int __thiscall
Fl_Text_Buffer::findchar_backward(Fl_Text_Buffer *this,int startPos,uint searchChar,int *foundPos)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = 0;
  if (startPos < 1) {
LAB_001cfe7a:
    startPos = 0;
LAB_001cfe7d:
    *foundPos = startPos;
    return iVar3;
  }
  iVar1 = this->mLength;
  if (iVar1 == 0) goto LAB_001cfe48;
  if (iVar1 < startPos) {
    startPos = iVar1;
  }
  do {
    startPos = prev_char_clipped(this,startPos);
    while( true ) {
      if (startPos < 0) goto LAB_001cfe7a;
      uVar2 = char_at(this,startPos);
      if (uVar2 == searchChar) {
        iVar3 = 1;
        goto LAB_001cfe7d;
      }
      if (startPos != 0) break;
LAB_001cfe48:
      startPos = -1;
    }
  } while( true );
}

Assistant:

int Fl_Text_Buffer::findchar_backward(int startPos, unsigned int searchChar,
				      int *foundPos) const {
  if (startPos <= 0) {
    *foundPos = 0;
    return 0;
  }
  
  if (startPos > mLength)
    startPos = mLength;
  
  for (startPos = prev_char(startPos); startPos>=0; startPos = prev_char(startPos)) {
    if (searchChar == char_at(startPos)) {
      *foundPos = startPos;
      return 1;
    }
  }
  
  *foundPos = 0;
  return 0;
}